

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

int raviX_construct_cfg(Proc *proc)

{
  BasicBlock *block_00;
  int iVar1;
  Graph *g_00;
  Instruction *pIVar2;
  undefined1 local_78 [8];
  PtrListIterator childprociter__;
  Proc *childproc;
  PtrListIterator pseudoiter__;
  Pseudo *pseudo;
  Instruction *insn;
  BasicBlock *block;
  uint i;
  Graph *g;
  Proc *proc_local;
  
  g_00 = raviX_init_graph(0,1,proc,proc->linearizer->compiler_state->allocator);
  block._4_4_ = 0;
  do {
    if (proc->node_count <= block._4_4_) {
      proc->cfg = g_00;
      raviX_ptrlist_forward_iterator((PtrListIterator *)local_78,(PtrList *)proc->procs);
      childprociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_78);
      while( true ) {
        if (childprociter__._16_8_ == 0) {
          return 0;
        }
        iVar1 = raviX_construct_cfg((Proc *)childprociter__._16_8_);
        if (iVar1 != 0) break;
        childprociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_78);
      }
      return 1;
    }
    block_00 = proc->nodes[block._4_4_];
    pIVar2 = raviX_last_instruction(block_00);
    if (pIVar2 != (Instruction *)0x0) {
      if (((*(char *)pIVar2 != 'I') && (*(char *)pIVar2 != 'H')) && (*(char *)pIVar2 != '\x01')) {
        return 1;
      }
      raviX_ptrlist_forward_iterator((PtrListIterator *)&childproc,(PtrList *)pIVar2->targets);
      pseudoiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&childproc);
      while (pseudoiter__._16_8_ != 0) {
        if ((*(uint *)pseudoiter__._16_8_ & 0xf) != 10) {
          __assert_fail("pseudo->type == PSEUDO_BLOCK",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/cfg.c"
                        ,0x2f,"int raviX_construct_cfg(Proc *)");
        }
        raviX_add_edge(g_00,block_00->index,**(nodeId_t **)(pseudoiter__._16_8_ + 8));
        pseudoiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&childproc);
      }
    }
    block._4_4_ = block._4_4_ + 1;
  } while( true );
}

Assistant:

int raviX_construct_cfg(Proc *proc)
{
	Graph *g = raviX_init_graph(ENTRY_BLOCK, EXIT_BLOCK, proc, proc->linearizer->compiler_state->allocator);
	for (unsigned i = 0; i < proc->node_count; i++) {
		BasicBlock *block = proc->nodes[i];
		Instruction *insn = raviX_last_instruction(block);
		if (insn == NULL)
			continue;
		if (insn->opcode == op_br || insn->opcode == op_cbr || insn->opcode == op_ret) {
			Pseudo *pseudo;
			FOR_EACH_PTR(insn->targets, Pseudo, pseudo)
			{
				assert(pseudo->type == PSEUDO_BLOCK);
				raviX_add_edge(g, block->index, pseudo->block->index);
			}
			END_FOR_EACH_PTR(pseudo)
		} else {
			return 1;
		}
	}
	proc->cfg = g;
	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		if (raviX_construct_cfg(childproc) != 0)
			return 1;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}